

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall
CGraphics_Threaded::QuadsText(CGraphics_Threaded *this,float x,float y,float Size,char *pText)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  float fVar7;
  CQuadItem QuadItem;
  float local_40;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = *pText;
  if (cVar1 != '\0') {
    pcVar4 = pText + 1;
    fVar6 = x;
    local_40 = y;
    do {
      if (cVar1 == '\n') {
        local_40 = local_40 + Size;
        fVar6 = x;
      }
      else {
        iVar2 = (int)cVar1;
        iVar3 = iVar2 + 0xf;
        if (-1 < cVar1) {
          iVar3 = iVar2;
        }
        fVar5 = (float)(iVar2 % 0x10) * 0.0625;
        fVar7 = (float)(iVar3 >> 4) * 0.0625;
        (**(code **)(*(long *)this + 0xd0))
                  (fVar5,fVar7,fVar5 + 0.0625,fVar7 + 0.0625,this,0xffffffff);
        local_2c = local_40;
        local_30 = fVar6;
        local_28 = Size;
        local_24 = Size;
        (**(code **)(*(long *)this + 0xe8))(this,&local_30,1);
        fVar6 = fVar6 + Size * 0.5;
      }
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::QuadsText(float x, float y, float Size, const char *pText)
{
	float StartX = x;

	while(*pText)
	{
		char c = *pText;
		pText++;

		if(c == '\n')
		{
			x = StartX;
			y += Size;
		}
		else
		{
			QuadsSetSubset(
				(c%16)/16.0f,
				(c/16)/16.0f,
				(c%16)/16.0f+1.0f/16.0f,
				(c/16)/16.0f+1.0f/16.0f);

			CQuadItem QuadItem(x, y, Size, Size);
			QuadsDrawTL(&QuadItem, 1);
			x += Size/2;
		}
	}
}